

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O2

void __thiscall OStream_LargeSpan_Test::TestBody(OStream_LargeSpan_Test *this)

{
  InSequence seq;
  MatcherBase<unsigned_long> local_190;
  MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> local_178;
  array<const_char,_7UL> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  local_138;
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> local_118;
  first_elements_are local_e0;
  first_elements_are local_c0;
  first_elements_are local_a0;
  test_ostream str;
  
  builtin_strncpy(v._M_elems,"abcdefg",7);
  anon_unknown.dwarf_14a7a1::test_ostream::test_ostream(&str);
  testing::InSequence::InSequence(&seq);
  s_abi_cxx11_(&local_158,"abc",3);
  std::__cxx11::string::string((string *)&local_a0,(string *)&local_158);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_138,&local_a0);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_178,
             (PolymorphicMatcher *)&local_138);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,3);
  anon_unknown.dwarf_14a7a1::test_ostream::gmock_flush_buffer
            (&local_118,&str,(Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_178
             ,(Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xae,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"abc\"s}), test_ostream::buffer_size)"
                    );
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
  ::~_Tuple_impl(&local_118.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
                );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_158);
  s_abi_cxx11_(&local_158,"def",3);
  std::__cxx11::string::string((string *)&local_c0,(string *)&local_158);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_138,&local_c0);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_178,
             (PolymorphicMatcher *)&local_138);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,3);
  anon_unknown.dwarf_14a7a1::test_ostream::gmock_flush_buffer
            (&local_118,&str,(Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_178
             ,(Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb0,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"def\"s}), test_ostream::buffer_size)"
                    );
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
  ::~_Tuple_impl(&local_118.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
                );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_158);
  s_abi_cxx11_(&local_158,"g",1);
  std::__cxx11::string::string((string *)&local_e0,(string *)&local_158);
  testing::Truly<(anonymous_namespace)::first_elements_are>(&local_138,&local_e0);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_178,
             (PolymorphicMatcher *)&local_138);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_190,1);
  anon_unknown.dwarf_14a7a1::test_ostream::gmock_flush_buffer
            (&local_118,&str,(Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)&local_178
             ,(Matcher<unsigned_long> *)&local_190);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
  InternalExpectedAt(&local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
                     ,0xb1,"str",
                     "flush_buffer (testing::Truly (first_elements_are{\"g\"s}), std::size_t{1})");
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
  ::~_Tuple_impl(&local_118.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
                );
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_190);
  testing::internal::MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            (&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_158);
  pstore::exchange::export_ns::ostream_base::write<7l>
            (&str.super_ostream_base,(span<const_char,_7L>)&v);
  pstore::exchange::export_ns::ostream_base::flush(&str.super_ostream_base);
  testing::InSequence::~InSequence(&seq);
  anon_unknown.dwarf_14a7a1::test_ostream::~test_ostream(&str);
  return;
}

Assistant:

TEST (OStream, LargeSpan) {
    std::array<char const, 7U> const v{{'a', 'b', 'c', 'd', 'e', 'f', 'g'}};

    test_ostream str;

    // TODO: here the code could optimize the case where more than a buffer's worth of data is
    // being written.
    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"abc"s}), test_ostream::buffer_size));
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"def"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"g"s}), std::size_t{1}));

    str.write (pstore::gsl::make_span (v));
    str.flush ();
}